

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
DefaultState<false>::String
          (DefaultState<false> *this,Context<false> *ctx,char *str,SizeType length,bool copy)

{
  char cVar1;
  uint in_ECX;
  char *in_RDX;
  long in_RSI;
  BaseState<false> *in_RDI;
  char *prepend;
  char *p;
  char *end;
  undefined3 in_stack_00000028;
  char *local_30;
  
  for (local_30 = in_RDX; local_30 != in_RDX + in_ECX; local_30 = local_30 + 1) {
    cVar1 = *local_30;
    if ((((cVar1 == '\t') || (cVar1 == ' ')) || (cVar1 == ':')) || (cVar1 == '|')) {
      *local_30 = '_';
    }
  }
  memmove(in_RDX + -(ulong)*(uint *)(in_RSI + 0x18),*(void **)(in_RSI + 0x10),
          (ulong)*(uint *)(in_RSI + 0x18));
  Context<false>::CurrentNamespace((Context<false> *)0x2b3072);
  Namespace<false>::AddFeature
            ((Namespace<false> *)str,(vw *)CONCAT44(length,_in_stack_00000028),end);
  return in_RDI;
}

Assistant:

BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool copy)
  {
    assert(!copy);

    // string escape
    const char* end = str + length;
    for (char* p = (char*)str; p != end; p++)
    {
      switch (*p)
      {
        case ' ':
        case '\t':
        case '|':
        case ':':
          *p = '_';
      }
    }

    char* prepend = (char*)str - ctx.key_length;
    memmove(prepend, ctx.key, ctx.key_length);

    ctx.CurrentNamespace().AddFeature(ctx.all, prepend);

    return this;
  }